

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O2

void __thiscall
chrono::ChBodyEasySphere::SetupBody
          (ChBodyEasySphere *this,double radius,double density,bool visualize,bool collide,
          shared_ptr<chrono::ChMaterialSurface> *material)

{
  shared_ptr<chrono::collision::ChCollisionModel> *psVar1;
  _func_int **pp_Var2;
  undefined7 in_register_00000011;
  double dVar3;
  shared_ptr<chrono::ChVisualModel> vmodel;
  shared_ptr<chrono::ChVisualShape> local_138;
  shared_ptr<chrono::ChSphereShape> vshape;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_108;
  ChQuaternion<double> local_f8;
  ChFrame<double> local_d8;
  ChVector<double> local_48;
  
  dVar3 = pow(radius,3.0);
  dVar3 = dVar3 * 4.1887902047863905 * density;
  pp_Var2 = (_func_int **)(radius * radius * dVar3 * 0.4);
  (this->super_ChBody).density = (float)density;
  ChVariablesBodyOwnMass::SetBodyMass(&(this->super_ChBody).variables,dVar3);
  local_d8._vptr_ChFrame = pp_Var2;
  local_d8.coord.pos.m_data[0] = (double)pp_Var2;
  local_d8.coord.pos.m_data[1] = (double)pp_Var2;
  ChBody::SetInertiaXX(&this->super_ChBody,(ChVector<double> *)&local_d8);
  if ((int)CONCAT71(in_register_00000011,collide) != 0) {
    if ((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      __assert_fail("material",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                    ,0x3f,
                    "void chrono::ChBodyEasySphere::SetupBody(double, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    psVar1 = &(this->super_ChBody).collision_model;
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_d8,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    (**(code **)(*local_d8._vptr_ChFrame + 0x18))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8.coord);
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_f8,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_108,
               &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
    ;
    local_d8.coord.pos.m_data[1] = 0.0;
    local_d8._vptr_ChFrame = (_func_int **)0x0;
    local_d8.coord.pos.m_data[0] = 0.0;
    (*(*(_func_int ***)local_f8.m_data[0])[5])(radius,local_f8.m_data[0],&local_108,&local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.m_data + 1));
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_d8,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    (**(code **)(*local_d8._vptr_ChFrame + 0x20))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8.coord);
    ChBody::SetCollide(&this->super_ChBody,true);
  }
  if (visualize) {
    chrono_types::make_shared<chrono::ChSphereShape,_0>();
    ((vshape.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->gsphere)
    .rad = radius;
    std::make_shared<chrono::ChVisualModel>();
    std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChSphereShape,void>
              ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_138,
               &vshape.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>);
    local_f8.m_data[0] = (double)&DAT_3ff0000000000000;
    local_48.m_data[2] = 0.0;
    local_f8.m_data[3] = 0.0;
    local_48.m_data[0] = 0.0;
    local_48.m_data[1] = 0.0;
    local_f8.m_data[1] = 0.0;
    local_f8.m_data[2] = 0.0;
    ChFrame<double>::ChFrame(&local_d8,&local_48,&local_f8);
    ChVisualModel::AddShape
              (vmodel.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_138,&local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_138.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_118,
               &vmodel.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>);
    ChPhysicsItem::AddVisualModel
              ((ChPhysicsItem *)this,(shared_ptr<chrono::ChVisualModel> *)&local_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&vmodel.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&vshape.super___shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void ChBodyEasySphere::SetupBody(double radius,
                                 double density,
                                 bool visualize,
                                 bool collide,
                                 std::shared_ptr<ChMaterialSurface> material) {
    double mmass = density * ((4.0 / 3.0) * CH_C_PI * pow(radius, 3));
    double inertia = (2.0 / 5.0) * mmass * pow(radius, 2);

    this->SetDensity((float)density);
    this->SetMass(mmass);
    this->SetInertiaXX(ChVector<>(inertia, inertia, inertia));

    if (collide) {
        assert(material);
        GetCollisionModel()->ClearModel();
        GetCollisionModel()->AddSphere(material, radius);
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }
    if (visualize) {
        auto vshape = chrono_types::make_shared<ChSphereShape>();
        vshape->GetSphereGeometry().rad = radius;
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        vmodel->AddShape(vshape);
        this->AddVisualModel(vmodel);
    }
}